

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::handleMessage
          (RunContext *this,AssertionInfo *info,OfType resultType,StringRef *message,
          AssertionReaction *reaction)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_120;
  AssertionResult local_c8;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[9])();
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  local_120.message._M_dataplus._M_p = (pointer)&local_120.message.field_2;
  local_120.message._M_string_length = 0;
  local_120.message.field_2._M_local_buf[0] = '\0';
  local_120.reconstructedExpression._M_dataplus._M_p =
       (pointer)&local_120.reconstructedExpression.field_2;
  local_120.reconstructedExpression._M_string_length = 0;
  local_120.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_120.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_120.lazyExpression.m_isNegated = false;
  local_120.resultType = resultType;
  StringRef::operator_cast_to_string((string *)&local_c8,message);
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_120.message,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_c8.m_info._48_8_ = *(undefined8 *)&(this->m_lastAssertionInfo).resultDisposition;
  local_c8.m_info.macroName.m_start = (this->m_lastAssertionInfo).macroName.m_start;
  local_c8.m_info.macroName.m_size = (this->m_lastAssertionInfo).macroName.m_size;
  local_c8.m_info.lineInfo.file = (this->m_lastAssertionInfo).lineInfo.file;
  local_c8.m_info.lineInfo.line = (this->m_lastAssertionInfo).lineInfo.line;
  local_c8.m_info.capturedExpression.m_start =
       (this->m_lastAssertionInfo).capturedExpression.m_start;
  local_c8.m_info.capturedExpression.m_size = (this->m_lastAssertionInfo).capturedExpression.m_size;
  AssertionResultData::AssertionResultData(&local_c8.m_resultData,&local_120);
  assertionEnded(this,&local_c8);
  if ((((undefined1)local_c8.m_resultData.resultType & FailureBit) != Ok) &&
     ((local_c8.m_info._48_8_ & 8) == 0)) {
    populateReaction(this,reaction);
  }
  AssertionResultData::~AssertionResultData(&local_c8.m_resultData);
  AssertionResultData::~AssertionResultData(&local_120);
  return;
}

Assistant:

void RunContext::handleMessage(
            AssertionInfo const& info,
            ResultWas::OfType resultType,
            StringRef const& message,
            AssertionReaction& reaction
    ) {
        m_reporter->assertionStarting( info );

        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        data.message = static_cast<std::string>(message);
        AssertionResult assertionResult{ m_lastAssertionInfo, data };
        assertionEnded( assertionResult );
        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }